

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_self_test(int verbose)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  char *local_208;
  char *exponents [6];
  unsigned_long mul_c_prev;
  unsigned_long dbl_c_prev;
  unsigned_long add_c_prev;
  mbedtls_mpi m;
  mbedtls_ecp_point P;
  mbedtls_ecp_point R;
  mbedtls_ecp_group grp;
  size_t i;
  int ret;
  int verbose_local;
  
  memcpy(&local_208,&PTR_anon_var_dwarf_83eb_00157050,0x30);
  mbedtls_ecp_group_init((mbedtls_ecp_group *)&R.Z.p);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&P.Z.p);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&m.p);
  mbedtls_mpi_init((mbedtls_mpi *)&add_c_prev);
  i._0_4_ = mbedtls_ecp_group_load((mbedtls_ecp_group *)&R.Z.p,MBEDTLS_ECP_DP_SECP192R1);
  if ((uint)i == 0) {
    if (verbose != 0) {
      printf("  ECP test #1 (constant op_count, base point G): ");
    }
    i._0_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&add_c_prev,2);
    if (((uint)i == 0) &&
       (i._0_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)&R.Z.p,(mbedtls_ecp_point *)&m.p,
                                  (mbedtls_mpi *)&add_c_prev,(mbedtls_ecp_point *)&grp.B.p,
                                  (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0),
       (uint)i == 0)) {
      add_count = 0;
      dbl_count = 0;
      mul_count = 0;
      i._0_4_ = mbedtls_mpi_read_string((mbedtls_mpi *)&add_c_prev,0x10,local_208);
      if (((uint)i == 0) &&
         (i._0_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)&R.Z.p,(mbedtls_ecp_point *)&P.Z.p,
                                    (mbedtls_mpi *)&add_c_prev,(mbedtls_ecp_point *)&grp.B.p,
                                    (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0),
         (uint)i == 0)) {
        for (grp.T_size = 1; uVar3 = mul_count, uVar2 = dbl_count, uVar1 = add_count, grp.T_size < 6
            ; grp.T_size = grp.T_size + 1) {
          add_count = 0;
          dbl_count = 0;
          mul_count = 0;
          i._0_4_ = mbedtls_mpi_read_string
                              ((mbedtls_mpi *)&add_c_prev,0x10,exponents[grp.T_size - 1]);
          if (((uint)i != 0) ||
             (i._0_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)&R.Z.p,(mbedtls_ecp_point *)&P.Z.p,
                                        (mbedtls_mpi *)&add_c_prev,(mbedtls_ecp_point *)&grp.B.p,
                                        (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0),
             (uint)i != 0)) goto LAB_001216d8;
          if ((add_count != uVar1) || ((dbl_count != uVar2 || (mul_count != uVar3)))) {
            if (verbose != 0) {
              printf("failed (%u)\n",grp.T_size & 0xffffffff);
            }
            i._0_4_ = 1;
            goto LAB_001216d8;
          }
        }
        if (verbose != 0) {
          printf("passed\n");
          printf("  ECP test #2 (constant op_count, other point): ");
        }
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;
        i._0_4_ = mbedtls_mpi_read_string((mbedtls_mpi *)&add_c_prev,0x10,local_208);
        if (((uint)i == 0) &&
           (i._0_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)&R.Z.p,(mbedtls_ecp_point *)&P.Z.p,
                                      (mbedtls_mpi *)&add_c_prev,(mbedtls_ecp_point *)&m.p,
                                      (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0),
           (uint)i == 0)) {
          for (grp.T_size = 1; uVar3 = mul_count, uVar2 = dbl_count, uVar1 = add_count,
              grp.T_size < 6; grp.T_size = grp.T_size + 1) {
            add_count = 0;
            dbl_count = 0;
            mul_count = 0;
            i._0_4_ = mbedtls_mpi_read_string
                                ((mbedtls_mpi *)&add_c_prev,0x10,exponents[grp.T_size - 1]);
            if (((uint)i != 0) ||
               (i._0_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)&R.Z.p,(mbedtls_ecp_point *)&P.Z.p,
                                          (mbedtls_mpi *)&add_c_prev,(mbedtls_ecp_point *)&m.p,
                                          (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0),
               (uint)i != 0)) goto LAB_001216d8;
            if ((add_count != uVar1) || ((dbl_count != uVar2 || (mul_count != uVar3)))) {
              if (verbose != 0) {
                printf("failed (%u)\n",grp.T_size & 0xffffffff);
              }
              i._0_4_ = 1;
              goto LAB_001216d8;
            }
          }
          if (verbose != 0) {
            printf("passed\n");
          }
        }
      }
    }
  }
LAB_001216d8:
  if (((int)(uint)i < 0) && (verbose != 0)) {
    printf("Unexpected error, return code = %08X\n",(ulong)(uint)i);
  }
  mbedtls_ecp_group_free((mbedtls_ecp_group *)&R.Z.p);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&P.Z.p);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&m.p);
  mbedtls_mpi_free((mbedtls_mpi *)&add_c_prev);
  if (verbose != 0) {
    printf(anon_var_dwarf_c75e + 8);
  }
  return (uint)i;
}

Assistant:

int mbedtls_ecp_self_test( int verbose )
{
    int ret;
    size_t i;
    mbedtls_ecp_group grp;
    mbedtls_ecp_point R, P;
    mbedtls_mpi m;
    unsigned long add_c_prev, dbl_c_prev, mul_c_prev;
    /* exponents especially adapted for secp192r1 */
    const char *exponents[] =
    {
        "000000000000000000000000000000000000000000000001", /* one */
        "FFFFFFFFFFFFFFFFFFFFFFFF99DEF836146BC9B1B4D22830", /* N - 1 */
        "5EA6F389A38B8BC81E767753B15AA5569E1782E30ABE7D25", /* random */
        "400000000000000000000000000000000000000000000000", /* one and zeros */
        "7FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", /* all ones */
        "555555555555555555555555555555555555555555555555", /* 101010... */
    };

    mbedtls_ecp_group_init( &grp );
    mbedtls_ecp_point_init( &R );
    mbedtls_ecp_point_init( &P );
    mbedtls_mpi_init( &m );

    /* Use secp192r1 if available, or any available curve */
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
    MBEDTLS_MPI_CHK( mbedtls_ecp_group_load( &grp, MBEDTLS_ECP_DP_SECP192R1 ) );
#else
    MBEDTLS_MPI_CHK( mbedtls_ecp_group_load( &grp, mbedtls_ecp_curve_list()->grp_id ) );
#endif

    if( verbose != 0 )
        mbedtls_printf( "  ECP test #1 (constant op_count, base point G): " );

    /* Do a dummy multiplication first to trigger precomputation */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &m, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &P, &m, &grp.G, NULL, NULL ) );

    add_count = 0;
    dbl_count = 0;
    mul_count = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[0] ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &grp.G, NULL, NULL ) );

    for( i = 1; i < sizeof( exponents ) / sizeof( exponents[0] ); i++ )
    {
        add_c_prev = add_count;
        dbl_c_prev = dbl_count;
        mul_c_prev = mul_count;
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[i] ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &grp.G, NULL, NULL ) );

        if( add_count != add_c_prev ||
            dbl_count != dbl_c_prev ||
            mul_count != mul_c_prev )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed (%u)\n", (unsigned int) i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  ECP test #2 (constant op_count, other point): " );
    /* We computed P = 2G last time, use it */

    add_count = 0;
    dbl_count = 0;
    mul_count = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[0] ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &P, NULL, NULL ) );

    for( i = 1; i < sizeof( exponents ) / sizeof( exponents[0] ); i++ )
    {
        add_c_prev = add_count;
        dbl_c_prev = dbl_count;
        mul_c_prev = mul_count;
        add_count = 0;
        dbl_count = 0;
        mul_count = 0;

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &m, 16, exponents[i] ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &R, &m, &P, NULL, NULL ) );

        if( add_count != add_c_prev ||
            dbl_count != dbl_c_prev ||
            mul_count != mul_c_prev )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed (%u)\n", (unsigned int) i );

            ret = 1;
            goto cleanup;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

cleanup:

    if( ret < 0 && verbose != 0 )
        mbedtls_printf( "Unexpected error, return code = %08X\n", ret );

    mbedtls_ecp_group_free( &grp );
    mbedtls_ecp_point_free( &R );
    mbedtls_ecp_point_free( &P );
    mbedtls_mpi_free( &m );

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( ret );
}